

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

void node::ImportBlocks(ChainstateManager *chainman,
                       span<const_fs::path,_18446744073709551615UL> import_paths)

{
  pointer *ppbVar1;
  _Base_ptr *pp_Var2;
  pointer pcVar3;
  Notifications *pNVar4;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  char cVar5;
  bool bVar6;
  Chainstate *this;
  FILE *file_00;
  char *in_RCX;
  uint uVar7;
  pointer ppCVar8;
  long lVar9;
  pointer ppCVar10;
  pointer __filename;
  int iVar11;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  shared_ptr<const_CBlock> pblock;
  string_view source_file_04;
  undefined8 in_stack_fffffffffffffe78;
  ChainstateManager *this_00;
  BlockManager *in_stack_fffffffffffffe88;
  pointer ppCVar12;
  undefined1 local_168 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_160;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_150;
  void *local_138;
  uchar auStack_130 [8];
  long local_128;
  uint local_120;
  uint32_t uStack_11c;
  undefined8 local_110;
  FlatFilePos pos;
  undefined8 local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  AutoFile file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
  blocks_with_unknown_parent;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  __filename = import_paths._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((chainman->m_blockman).m_importing._M_base._M_i & 1U) != 0) {
    __assert_fail("m_importing == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                  ,0x4ab,"node::ImportingNow::ImportingNow(std::atomic<bool> &)");
  }
  LOCK();
  (chainman->m_blockman).m_importing._M_base._M_i = true;
  UNLOCK();
  if (((chainman->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) == 0) {
    in_stack_fffffffffffffe88 = &chainman->m_blockman;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
         0xffffffff00000000;
    uVar7 = 0;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = chainman;
    blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pos.nPos = 0;
      pos.nFile = uVar7;
      FlatFileSeq::FileName((path *)&file,&(chainman->m_blockman).m_block_file_seq,&pos);
      cVar5 = std::filesystem::status((path *)&file);
      std::filesystem::__cxx11::path::~path((path *)&file);
      iVar11 = 3;
      if ((cVar5 != '\0') && (cVar5 != -1)) {
        BlockManager::OpenBlockFile(&file,in_stack_fffffffffffffe88,&pos,true);
        if (file.m_file == (FILE *)0x0) {
          iVar11 = 3;
        }
        else {
          local_120 = uVar7;
          logging_function._M_str = "ImportBlocks";
          logging_function._M_len = 0xc;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
          ;
          source_file._M_len = 0x65;
          LogPrintFormatInternal<unsigned_int>
                    (logging_function,source_file,0x4c8,ALL,Info,(ConstevalFormatString<1U>)0x7ebe09
                     ,&stack0xfffffffffffffee0);
          ChainstateManager::LoadExternalBlockFile(this_00,&file,&pos,&blocks_with_unknown_parent);
          bVar6 = util::SignalInterrupt::operator_cast_to_bool(this_00->m_interrupt);
          if (bVar6) {
            iVar11 = 1;
            logging_function_00._M_str = "ImportBlocks";
            logging_function_00._M_len = 0xc;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
            ;
            source_file_00._M_len = 0x65;
            LogPrintFormatInternal<char[13]>
                      (logging_function_00,source_file_00,0x4cb,ALL,Info,
                       (ConstevalFormatString<1U>)0x7ebe2f,(char (*) [13])"ImportBlocks");
          }
          else {
            uVar7 = uVar7 + 1;
            iVar11 = 0;
          }
        }
        AutoFile::~AutoFile(&file);
      }
    } while (iVar11 == 0);
    if (iVar11 != 3) {
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_FlatFilePos>,_std::_Select1st<std::pair<const_uint256,_FlatFilePos>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
      ::~_Rb_tree(&blocks_with_unknown_parent._M_t);
      goto LAB_0020f903;
    }
    file.m_file = (FILE *)&cs_main;
    file.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&file);
    chainman = this_00;
    CDBWrapper::Erase<unsigned_char>
              (&((this_00->m_blockman).m_block_tree_db._M_t.
                 super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                 .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                super_CDBWrapper,"Rl\x01",false);
    std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&file)
    ;
    LOCK();
    (this_00->m_blockman).m_blockfiles_indexed._M_base._M_i = true;
    UNLOCK();
    logging_function_01._M_str = "ImportBlocks";
    logging_function_01._M_len = 0xc;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_01._M_len = 0x65;
    in_RCX = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    LogPrintFormatInternal<>
              (logging_function_01,source_file_01,0x4d2,ALL,Info,(ConstevalFormatString<0U>)0x7ebe4d
              );
    this = ChainstateManager::ActiveChainstate(chainman);
    Chainstate::LoadGenesisBlock(this);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_FlatFilePos>,_std::_Select1st<std::pair<const_uint256,_FlatFilePos>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
    ::~_Rb_tree(&blocks_with_unknown_parent._M_t);
  }
  this_00 = chainman;
  if (import_paths._M_extent._M_extent_value._M_extent_value != 0) {
    ppbVar1 = &file.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish;
    lVar9 = import_paths._M_extent._M_extent_value._M_extent_value * 0x28;
    do {
      file_00 = fsbridge::fopen((char *)__filename,"rb");
      local_138 = (void *)0x0;
      auStack_130[0] = '\0';
      auStack_130[1] = '\0';
      auStack_130[2] = '\0';
      auStack_130[3] = '\0';
      auStack_130[4] = '\0';
      auStack_130[5] = '\0';
      auStack_130[6] = '\0';
      auStack_130[7] = '\0';
      local_128 = 0;
      data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)this_00;
      data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe78;
      data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe88;
      AutoFile::AutoFile((AutoFile *)&blocks_with_unknown_parent,(FILE *)file_00,data_xor);
      if (local_138 != (void *)0x0) {
        operator_delete(local_138,local_128 - (long)local_138);
      }
      file.m_file = (FILE *)ppbVar1;
      if (blocks_with_unknown_parent._M_t._M_impl._0_8_ == 0) {
        pcVar3 = (__filename->super_path)._M_pathname._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&file,pcVar3,
                   pcVar3 + (__filename->super_path)._M_pathname._M_string_length);
        logging_function_03._M_str = "ImportBlocks";
        logging_function_03._M_len = 0xc;
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file_03._M_len = 0x65;
        in_RCX = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
        ;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_03,source_file_03,0x4e2,ALL,Info,
                   (ConstevalFormatString<1U>)0x7ebe82,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
        if (file.m_file != (FILE *)ppbVar1) {
          operator_delete(file.m_file,
                          (ulong)(file.m_xor.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_finish + 1));
        }
      }
      else {
        pcVar3 = (__filename->super_path)._M_pathname._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&file,pcVar3,
                   pcVar3 + (__filename->super_path)._M_pathname._M_string_length);
        logging_function_02._M_str = "ImportBlocks";
        logging_function_02._M_len = 0xc;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file_02._M_len = 0x65;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_02,source_file_02,0x4db,ALL,Info,
                   (ConstevalFormatString<1U>)0x7ebe65,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
        if (file.m_file != (FILE *)ppbVar1) {
          operator_delete(file.m_file,
                          (ulong)(file.m_xor.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_finish + 1));
        }
        in_RCX = (char *)0x0;
        ChainstateManager::LoadExternalBlockFile
                  (chainman,(AutoFile *)&blocks_with_unknown_parent,(FlatFilePos *)0x0,
                   (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                    *)0x0);
        bVar6 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
        if (bVar6) {
          logging_function_04._M_str = "ImportBlocks";
          logging_function_04._M_len = 0xc;
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
          ;
          source_file_04._M_len = 0x65;
          LogPrintFormatInternal<char[13]>
                    (logging_function_04,source_file_04,0x4de,ALL,Info,
                     (ConstevalFormatString<1U>)0x7ebe2f,(char (*) [13])"ImportBlocks");
          AutoFile::~AutoFile((AutoFile *)&blocks_with_unknown_parent);
          goto LAB_0020f903;
        }
      }
      AutoFile::~AutoFile((AutoFile *)&blocks_with_unknown_parent);
      __filename = __filename + 1;
      lVar9 = lVar9 + -0x28;
    } while (lVar9 != 0);
  }
  blocks_with_unknown_parent._M_t._M_impl._0_8_ = &cs_main;
  blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&blocks_with_unknown_parent);
  ChainstateManager::GetAll(&local_150,this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&blocks_with_unknown_parent);
  if (local_150.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_150.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pp_Var2 = &blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ppCVar8 = local_150.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar10 = local_150.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppCVar12 = local_150.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    do {
      while( true ) {
        blocks_with_unknown_parent._M_t._M_impl._0_8_ = 0;
        blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             ((ulong)blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             & 0xffffffffffffff00);
        local_48._M_local_buf[0] = '\0';
        local_168._0_4_ = 0;
        local_168[4] = '\0';
        local_168[5] = '\0';
        local_168[6] = '\0';
        local_168[7] = '\0';
        p_Stack_160 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RCX;
        pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_168;
        blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pp_Var2;
        blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)&local_48;
        bVar6 = Chainstate::ActivateBestChain
                          (*ppCVar8,(BlockValidationState *)&blocks_with_unknown_parent,pblock);
        if (p_Stack_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_160);
        }
        if (!bVar6) break;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_node_count !=
            &local_48) {
          operator_delete((void *)blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count,
                          CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) +
                          1);
        }
        if ((_Base_ptr *)
            blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != pp_Var2
           ) {
          operator_delete((void *)blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._0_8_,
                          (ulong)((long)&(blocks_with_unknown_parent._M_t._M_impl.
                                          super__Rb_tree_header._M_header._M_left)->_M_color + 1));
        }
        ppCVar8 = ppCVar8 + 1;
        if (ppCVar8 == ppCVar10) goto LAB_0020f891;
      }
      pNVar4 = (this_00->m_options).notifications;
      pos = (FlatFilePos)&stack0xffffffffffffff10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&pos,"Failed to connect best block (%s).","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Failed to connect best block (%s).","");
        ppCVar10 = ppCVar12;
      }
      else {
        _local_120 = "Failed to connect best block (%s).";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_e0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                   (char **)&stack0xfffffffffffffee0);
        ppCVar10 = ppCVar12;
      }
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((string *)&stack0xfffffffffffffee0,
                 (ValidationState<BlockValidationResult> *)&blocks_with_unknown_parent);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)&file,(tinyformat *)&pos,(bilingual_str *)&stack0xfffffffffffffee0
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
      (*pNVar4->_vptr_Notifications[8])(pNVar4,(bilingual_str *)&file);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)file.m_position.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload._M_value != &local_90) {
        operator_delete((void *)file.m_position.super__Optional_base<long,_true,_true>._M_payload.
                                super__Optional_payload_base<long>._M_payload,
                        local_90._M_allocated_capacity + 1);
      }
      if (file.m_file !=
          (FILE *)&file.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
        operator_delete(file.m_file,
                        (ulong)(file.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1));
      }
      ppCVar12 = ppCVar10;
      if (_local_120 != (char *)&stack0xfffffffffffffef0) {
        operator_delete(_local_120,(ulong)(local_110 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (pos != (FlatFilePos)&stack0xffffffffffffff10) {
        operator_delete((void *)pos,local_f0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          &local_48) {
        operator_delete((void *)blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,
                        CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
        ;
      }
      if ((_Base_ptr *)blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
          != pp_Var2) {
        operator_delete((void *)blocks_with_unknown_parent._M_t._M_impl.super__Rb_tree_header.
                                _M_header._0_8_,
                        (ulong)((long)&(blocks_with_unknown_parent._M_t._M_impl.
                                        super__Rb_tree_header._M_header._M_left)->_M_color + 1));
      }
      ppCVar8 = ppCVar8 + 1;
    } while (bVar6 && ppCVar8 != ppCVar10);
  }
LAB_0020f891:
  if (local_150.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0020f903:
  if (((this_00->m_blockman).m_importing._M_base._M_i & 1U) == 0) {
    __assert_fail("m_importing == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                  ,0x4b0,"node::ImportingNow::~ImportingNow()");
  }
  LOCK();
  (this_00->m_blockman).m_importing._M_base._M_i = false;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ImportBlocks(ChainstateManager& chainman, std::span<const fs::path> import_paths)
{
    ImportingNow imp{chainman.m_blockman.m_importing};

    // -reindex
    if (!chainman.m_blockman.m_blockfiles_indexed) {
        int nFile = 0;
        // Map of disk positions for blocks with unknown parent (only used for reindex);
        // parent hash -> child disk position, multiple children can have the same parent.
        std::multimap<uint256, FlatFilePos> blocks_with_unknown_parent;
        while (true) {
            FlatFilePos pos(nFile, 0);
            if (!fs::exists(chainman.m_blockman.GetBlockPosFilename(pos))) {
                break; // No block files left to reindex
            }
            AutoFile file{chainman.m_blockman.OpenBlockFile(pos, true)};
            if (file.IsNull()) {
                break; // This error is logged in OpenBlockFile
            }
            LogPrintf("Reindexing block file blk%05u.dat...\n", (unsigned int)nFile);
            chainman.LoadExternalBlockFile(file, &pos, &blocks_with_unknown_parent);
            if (chainman.m_interrupt) {
                LogPrintf("Interrupt requested. Exit %s\n", __func__);
                return;
            }
            nFile++;
        }
        WITH_LOCK(::cs_main, chainman.m_blockman.m_block_tree_db->WriteReindexing(false));
        chainman.m_blockman.m_blockfiles_indexed = true;
        LogPrintf("Reindexing finished\n");
        // To avoid ending up in a situation without genesis block, re-try initializing (no-op if reindexing worked):
        chainman.ActiveChainstate().LoadGenesisBlock();
    }

    // -loadblock=
    for (const fs::path& path : import_paths) {
        AutoFile file{fsbridge::fopen(path, "rb")};
        if (!file.IsNull()) {
            LogPrintf("Importing blocks file %s...\n", fs::PathToString(path));
            chainman.LoadExternalBlockFile(file);
            if (chainman.m_interrupt) {
                LogPrintf("Interrupt requested. Exit %s\n", __func__);
                return;
            }
        } else {
            LogPrintf("Warning: Could not open blocks file %s\n", fs::PathToString(path));
        }
    }

    // scan for better chains in the block chain database, that are not yet connected in the active best chain

    // We can't hold cs_main during ActivateBestChain even though we're accessing
    // the chainman unique_ptrs since ABC requires us not to be holding cs_main, so retrieve
    // the relevant pointers before the ABC call.
    for (Chainstate* chainstate : WITH_LOCK(::cs_main, return chainman.GetAll())) {
        BlockValidationState state;
        if (!chainstate->ActivateBestChain(state, nullptr)) {
            chainman.GetNotifications().fatalError(strprintf(_("Failed to connect best block (%s)."), state.ToString()));
            return;
        }
    }
    // End scope of ImportingNow
}